

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::rowSingletons(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  int iVar1;
  int iVar2;
  int p_col;
  int iVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  pointer pnVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  pointer pnVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  long lVar19;
  long lVar20;
  byte bVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pval;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar21 = 0;
  pval.m_backend.data._M_elems[0] = 0;
  pval.m_backend.data._M_elems[1] = 0;
  pval.m_backend.data._M_elems[2] = 0;
  pval.m_backend.data._M_elems[3] = 0;
  pval.m_backend.data._M_elems[4] = 0;
  pval.m_backend.data._M_elems[5] = 0;
  pval.m_backend.data._M_elems[6] = 0;
  pval.m_backend.data._M_elems[7] = 0;
  pval.m_backend.data._M_elems[8] = 0;
  pval.m_backend.data._M_elems[9] = 0;
  pval.m_backend.data._M_elems[10] = 0;
  pval.m_backend.data._M_elems[0xb] = 0;
  pval.m_backend.data._M_elems[0xc] = 0;
  pval.m_backend.data._M_elems[0xd] = 0;
  pval.m_backend.data._M_elems[0xe] = 0;
  pval.m_backend.data._M_elems[0xf] = 0;
  pval.m_backend.data._M_elems[0x10] = 0;
  pval.m_backend.data._M_elems[0x11] = 0;
  pval.m_backend.data._M_elems[0x12] = 0;
  pval.m_backend.data._M_elems[0x13] = 0;
  pval.m_backend.data._M_elems[0x14] = 0;
  pval.m_backend.data._M_elems[0x15] = 0;
  pval.m_backend.data._M_elems[0x16] = 0;
  pval.m_backend.data._M_elems[0x17] = 0;
  pval.m_backend.data._M_elems[0x18] = 0;
  pval.m_backend.data._M_elems[0x19] = 0;
  pval.m_backend.data._M_elems._104_5_ = 0;
  pval.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  piVar5 = (this->row).perm;
  piVar6 = (this->u).row.len;
  piVar7 = (this->temp).s_mark;
  lVar19 = (long)(this->temp).stage;
  for (lVar14 = 0; lVar14 < this->thedim; lVar14 = lVar14 + 1) {
    if ((piVar5[lVar14] < 0) && (piVar6[lVar14] == 1)) {
      iVar1 = (this->temp).stage;
      (this->temp).stage = iVar1 + 1;
      piVar7[iVar1] = (int)lVar14;
    }
  }
  do {
    if ((this->temp).stage <= lVar19) {
      return;
    }
    iVar1 = piVar7[lVar19];
    iVar2 = (this->u).row.start[iVar1];
    pnVar8 = (this->u).row.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_col = (this->u).row.idx[iVar2];
    lVar14 = 0x1c;
    pnVar16 = pnVar8 + iVar2;
    pnVar17 = &pval;
    for (lVar12 = lVar14; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar17->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar21 * -2 + 1) * 4);
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    pval.m_backend.exp = pnVar8[iVar2].m_backend.exp;
    pval.m_backend.neg = pnVar8[iVar2].m_backend.neg;
    pval.m_backend.fpclass = pnVar8[iVar2].m_backend.fpclass;
    pval.m_backend.prec_elem = pnVar8[iVar2].m_backend.prec_elem;
    pnVar17 = &pval;
    pnVar18 = &local_b0;
    for (; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    local_b0.m_backend.exp = pval.m_backend.exp;
    local_b0.m_backend.neg = pval.m_backend.neg;
    local_b0.m_backend.fpclass = pval.m_backend.fpclass;
    local_b0.m_backend.prec_elem = pval.m_backend.prec_elem;
    setPivot(this,(int)lVar19,p_col,iVar1,&local_b0);
    (this->u).row.len[iVar1] = 0;
    iVar2 = (this->u).col.start[p_col];
    piVar5 = (this->u).col.idx;
    iVar11 = (this->temp).s_cact[p_col];
    iVar10 = makeLvec(this,iVar11 + -1,iVar1);
    piVar6 = (this->u).col.len;
    iVar3 = piVar6[p_col];
    iVar11 = iVar3 - iVar11;
    piVar6[p_col] = iVar11;
    for (lVar14 = (long)iVar11; lVar14 < iVar3; lVar14 = lVar14 + 1) {
      iVar11 = piVar5[iVar2 + lVar14];
      if (iVar11 != iVar1) {
        piVar6 = (this->u).row.len;
        iVar4 = piVar6[iVar11];
        piVar6[iVar11] = iVar4 + -1;
        lVar13 = (long)(iVar4 + -1 + (this->u).row.start[iVar11]);
        lVar12 = lVar13 * 0x80 + 0x80;
        lVar9 = lVar13 * 4;
        do {
          lVar20 = lVar9;
          lVar15 = lVar12;
          lVar12 = lVar15 + -0x80;
          lVar9 = lVar20 + -4;
        } while (*(int *)((long)(this->u).row.idx + lVar20) != p_col);
        (this->l).idx[iVar10] = iVar11;
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result.m_backend,
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)(this->u).row.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                   lVar15),&pval.m_backend);
        pnVar8 = (this->l).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar17 = &result;
        pnVar16 = pnVar8 + iVar10;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pnVar16->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        pnVar8[iVar10].m_backend.exp = result.m_backend.exp;
        pnVar8[iVar10].m_backend.neg = result.m_backend.neg;
        pnVar8[iVar10].m_backend.fpclass = result.m_backend.fpclass;
        pnVar8[iVar10].m_backend.prec_elem = result.m_backend.prec_elem;
        iVar10 = iVar10 + 1;
        piVar6 = (this->u).row.idx;
        *(int *)((long)piVar6 + lVar20) = piVar6[lVar13];
        pnVar8 = (this->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)
                   ((long)pnVar8[-1].m_backend.data._M_elems + lVar15),&pnVar8[lVar13].m_backend);
        if (iVar4 == 2) {
          iVar4 = (this->temp).stage;
          (this->temp).stage = iVar4 + 1;
          piVar7[iVar4] = iVar11;
        }
        else if (iVar4 == 1) {
          this->stat = SINGULAR;
          return;
        }
      }
    }
    lVar19 = lVar19 + 1;
  } while( true );
}

Assistant:

void CLUFactor<R>::rowSingletons()
{
   R pval;
   int i, j, k, ll, r;
   int p_row, p_col, len, rs, lk;
   int* idx;
   int* rperm = row.perm;
   int* sing = temp.s_mark;

   /*  Mark row singletons
    */
   rs = temp.stage;

   for(i = 0; i < thedim; ++i)
   {
      if(rperm[i] < 0 && u.row.len[i] == 1)
         sing[temp.stage++] = i;
   }

   /*  Eliminate row singletons
    *  thereby marking newly arising ones
    *  until no more can be found.
    */
   for(; rs < temp.stage; ++rs)
   {
      /*      Move pivot element from row file to diag
       */
      p_row = sing[rs];
      j = u.row.start[p_row];
      p_col = u.row.idx[j];
      pval = u.row.val[j];
      setPivot(rs, p_col, p_row, pval);
      u.row.len[p_row] = 0;

      /*      Remove pivot column form workingmatrix
       *      thereby building up L VectorBase<R>.
       */
      idx = &(u.col.idx[u.col.start[p_col]]);
      i = temp.s_cact[p_col];                /* nr. nonzeros of new L VectorBase<R> */
      lk = makeLvec(i - 1, p_row);
      len = u.col.len[p_col];
      i = (u.col.len[p_col] -= i);         /* remove pivot column from U */

      for(; i < len; ++i)
      {
         r = idx[i];

         if(r != p_row)
         {
            /*      Find pivot column in row.
             */
            ll = --(u.row.len[r]);
            k = u.row.start[r] + ll;

            for(j = k; u.row.idx[j] != p_col; --j)
               ;

            assert(k >= u.row.start[r]);

            /*      Initialize L VectorBase<R>
             */
            l.idx[lk] = r;

            l.val[lk] = u.row.val[j] / pval;

            ++lk;

            /*      Remove pivot column from row.
             */
            u.row.idx[j] = u.row.idx[k];

            u.row.val[j] = u.row.val[k];

            /*      Check new row length.
             */
            if(ll == 1)
               sing[temp.stage++] = r;
            else if(ll == 0)
            {
               this->stat = SLinSolver<R>::SINGULAR;
               return;
            }
         }
      }
   }
}